

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__gif_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  undefined1 local_88b0 [8];
  stbi__gif g;
  stbi_uc *u;
  stbi__result_info *ri_local;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  g.delay = 0;
  g._34924_4_ = 0;
  memset(local_88b0,0,0x8870);
  g._34920_8_ = stbi__gif_load_next(s,(stbi__gif *)local_88b0,comp,req_comp,(stbi_uc *)0x0);
  if ((stbi__context *)g._34920_8_ == s) {
    g.delay = 0;
    g._34924_4_ = 0;
  }
  if (g._34920_8_ == 0) {
    if (g._0_8_ != 0) {
      free((void *)g._0_8_);
    }
  }
  else {
    *x = local_88b0._0_4_;
    *y = local_88b0._4_4_;
    if ((req_comp != 0) && (req_comp != 4)) {
      g._34920_8_ = stbi__convert_format
                              ((uchar *)g._34920_8_,4,req_comp,local_88b0._0_4_,local_88b0._4_4_);
    }
  }
  free(g.background);
  free(g.out);
  return (void *)g._34920_8_;
}

Assistant:

static void *stbi__gif_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *u = 0;
   stbi__gif g;
   memset(&g, 0, sizeof(g));
   STBI_NOTUSED(ri);

   u = stbi__gif_load_next(s, &g, comp, req_comp, 0);
   if (u == (stbi_uc *) s) u = 0;  // end of animated gif marker
   if (u) {
      *x = g.w;
      *y = g.h;

      // moved conversion to after successful load so that the same
      // can be done for multiple frames. 
      if (req_comp && req_comp != 4)
         u = stbi__convert_format(u, 4, req_comp, g.w, g.h);
   } else if (g.out) {
      // if there was an error and we allocated an image buffer, free it!
      STBI_FREE(g.out);
   }

   // free buffers needed for multiple frame loading; 
   STBI_FREE(g.history);
   STBI_FREE(g.background); 

   return u;
}